

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
__thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>
::
get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>
           *this,simplex_t idx,dimension_t dim,vertex_t n,
          reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *out)

{
  long lVar1;
  bool bVar2;
  vertex_t vVar3;
  byte bVar4;
  undefined7 in_register_00000011;
  long lVar5;
  long *in_R9;
  uint uVar6;
  simplex_t idx_00;
  
  idx_00 = CONCAT71(in_register_00000011,dim);
  bVar4 = (char)n + 1;
  if ((char)bVar4 < '\x02') {
    lVar5 = *in_R9;
  }
  else {
    vVar3 = (int)out + -1;
    uVar6 = (uint)bVar4;
    do {
      vVar3 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::get_max_vertex
                        ((Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *)
                         (idx + 0x30),idx_00,(dimension_t)uVar6,vVar3);
      lVar1 = *in_R9;
      lVar5 = lVar1 + -4;
      *in_R9 = lVar5;
      *(vertex_t *)(lVar1 + -4) = vVar3;
      idx_00 = idx_00 - ((long)vVar3 <<
                        ((char)((Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
                                 *)(idx + 0x30))->bits_per_vertex * (char)(uVar6 - 1) & 0x3fU));
      bVar2 = 2 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
  }
  *(int *)(lVar5 + -4) = (int)idx_00;
  *(long *)this = lVar5;
  return (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this;
}

Assistant:

OutputIterator get_simplex_vertices(simplex_t idx, const dimension_t dim, vertex_t n,
        OutputIterator out) const {
      --n;
      for (dimension_t k = dim + 1; k > 1; --k) {
        n = simplex_encoding.get_max_vertex(idx, k, n);
        *out++ = n;
        idx -= simplex_encoding(n, k);
      }
      *out = static_cast<vertex_t>(idx);
      return out;
    }